

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * stbi_hdr_load_rgbe(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  uchar *result;
  FILE *f;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    e("Unable to open file");
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)stbi_hdr_load_rgbe_file((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return (stbi_uc *)filename_local;
}

Assistant:

stbi_uc *stbi_hdr_load_rgbe        (char const *filename,           int *x, int *y, int *comp, int req_comp)
{
   FILE *f = fopen(filename, "rb");
   unsigned char *result;
   if (!f) return epuc("can't fopen", "Unable to open file");
   result = stbi_hdr_load_rgbe_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}